

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode
JsTTDPreExecuteSnapShotInterval
          (JsRuntimeHandle runtimeHandle,int64_t startSnapTime,int64_t endSnapTime,
          JsTTDMoveMode moveMode,int64_t *newTargetEventTime)

{
  ThreadContext *threadContext;
  EventLog *this;
  ExecutionInfoManager *this_00;
  bool bVar1;
  JsErrorCode JVar2;
  int64 iVar3;
  JsrtRuntime *runtime_00;
  JsrtRuntime *runtime;
  AutoNestedHandledExceptionType local_68 [2];
  TTDebuggerAbortException abortException;
  
  *newTargetEventTime = -1;
  runtime_00 = (JsrtRuntime *)startSnapTime;
  ThreadContext::ValidateThreadContext(*runtimeHandle);
  threadContext = *runtimeHandle;
  this = threadContext->TTDLog;
  if (this != (EventLog *)0x0) {
    this_00 = threadContext->TTDExecutionInfo;
    JVar2 = TTDHandleBreakpointInfoAndInflate(startSnapTime,runtime_00,threadContext);
    if (JVar2 == JsNoError) {
      if ((moveMode & JsTTDMoveScanIntervalForContinueInActiveBreakpointSegment) != JsTTDMoveNone) {
        AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                  (local_68,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
        TTD::ExecutionInfoManager::SetBPInfoForActiveSegmentContinueScan
                  (this_00,threadContext->TTDContext);
        AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_68);
      }
      TTD::EventLog::PushMode(this,DebuggerSuppressBreakpoints);
      TTD::EventLog::PushMode(this,DebuggerLogBreakpoints);
      iVar3 = 0x7fffffffffffffff;
      if (endSnapTime != -1) {
        iVar3 = endSnapTime;
      }
      TTD::EventLog::ReplayRootEventsToTime(this,iVar3);
      TTD::EventLog::PopMode(this,DebuggerLogBreakpoints);
      TTD::EventLog::PopMode(this,DebuggerSuppressBreakpoints);
      if ((moveMode & JsTTDMoveScanIntervalForContinueInActiveBreakpointSegment) != JsTTDMoveNone) {
        AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                  (local_68,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
        TTD::ExecutionInfoManager::ClearBPInfoForActiveSegmentContinueScan
                  (this_00,threadContext->TTDContext);
        AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_68);
      }
      JVar2 = JsNoError;
      if ((moveMode & JsTTDMoveScanIntervalForContinue) != JsTTDMoveNone) {
        bVar1 = TTD::ExecutionInfoManager::TryFindAndSetPreviousBP(this_00);
        if (bVar1) {
          iVar3 = TTD::ExecutionInfoManager::GetPendingTTDBPTargetEventTime(this_00);
          *newTargetEventTime = iVar3;
          JVar2 = JsNoError;
        }
      }
    }
    return JVar2;
  }
  TTDAbort_unrecoverable_error("Should only happen in TT debugging mode.");
}

Assistant:

CHAKRA_API JsTTDPreExecuteSnapShotInterval(_In_ JsRuntimeHandle runtimeHandle, _In_ int64_t startSnapTime, _In_ int64_t endSnapTime, _In_ JsTTDMoveMode moveMode, _Out_ int64_t* newTargetEventTime)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else

    *newTargetEventTime = -1;

    JsrtRuntime* runtime = JsrtRuntime::FromHandle(runtimeHandle);
    ThreadContext* threadContext = runtime->GetThreadContext();
    TTDAssert(threadContext->IsRuntimeInTTDMode(), "Should only happen in TT debugging mode.");

    TTD::EventLog* elog = threadContext->TTDLog;
    TTD::ExecutionInfoManager* emanager = threadContext->TTDExecutionInfo;
    JsErrorCode res = JsNoError;

    JsErrorCode inflateStatus = TTDHandleBreakpointInfoAndInflate(startSnapTime, runtime, threadContext);
    if(inflateStatus != JsNoError)
    {
        return inflateStatus;
    }

    //If we are in the "active" segment set the continue breakpoint
    if((moveMode & JsTTDMoveMode::JsTTDMoveScanIntervalForContinueInActiveBreakpointSegment) == JsTTDMoveMode::JsTTDMoveScanIntervalForContinueInActiveBreakpointSegment)
    {
        GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode
        {
            emanager->SetBPInfoForActiveSegmentContinueScan(threadContext->TTDContext);

            return JsNoError;
        });
    }

    elog->PushMode(TTD::TTDMode::DebuggerSuppressBreakpoints);
    elog->PushMode(TTD::TTDMode::DebuggerLogBreakpoints);
    try
    {
        if(endSnapTime == -1)
        {
            elog->ReplayRootEventsToTime(TTD_EVENT_MAXTIME);
        }
        else
        {
            elog->ReplayRootEventsToTime(endSnapTime);
        }
    }
    catch(TTD::TTDebuggerAbortException abortException)
    {
        //If we hit the end of the log or we hit a terminal exception that is fine -- anything else is a problem
        if(!abortException.IsEndOfLog() && !abortException.IsTopLevelException())
        {
            res = JsErrorFatal;
        }
    }
    catch(...) //we are replaying something that should be known to execute successfully so encountering any error is very bad
    {
        res = JsErrorFatal;
        TTDAssert(false, "Unexpected fatal Error");
    }
    elog->PopMode(TTD::TTDMode::DebuggerLogBreakpoints);
    elog->PopMode(TTD::TTDMode::DebuggerSuppressBreakpoints);

    //If we are in the "active" segment un-set the continue breakpoint
    if((moveMode & JsTTDMoveMode::JsTTDMoveScanIntervalForContinueInActiveBreakpointSegment) == JsTTDMoveMode::JsTTDMoveScanIntervalForContinueInActiveBreakpointSegment)
    {
        GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode
        {
            emanager->ClearBPInfoForActiveSegmentContinueScan(threadContext->TTDContext);

            return JsNoError;
        });
    }

    if((moveMode & JsTTDMoveMode::JsTTDMoveScanIntervalForContinue) == JsTTDMoveMode::JsTTDMoveScanIntervalForContinue)
    {
        bool bpFound = emanager->TryFindAndSetPreviousBP();
        if(bpFound)
        {
            *newTargetEventTime = emanager->GetPendingTTDBPTargetEventTime();
        }
    }

    return res;
#endif
}